

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_context.cc
# Opt level: O0

pair<const_char_*,_unsigned_int> google::protobuf::internal::VarintParseSlow32(char *p,uint32_t res)

{
  pair<const_char_*,_unsigned_int> pVar1;
  int local_54;
  void *local_50;
  char *local_48;
  uint local_40;
  uint local_3c;
  uint32_t byte_1;
  uint32_t i_1;
  uint local_2c;
  uint local_28;
  uint32_t byte;
  uint32_t i;
  uint32_t res_local;
  char *p_local;
  undefined4 local_10;
  
  byte = res;
  for (local_28 = 1; _i = p, local_28 < 5; local_28 = local_28 + 1) {
    local_2c = (uint)(byte)p[local_28];
    byte = (local_2c - 1 << ((char)local_28 * '\a' & 0x1fU)) + byte;
    if (local_2c < 0x80) {
      _byte_1 = p + (ulong)local_28 + 1;
      std::pair<const_char_*,_unsigned_int>::pair<const_char_*,_unsigned_int_&,_true>
                ((pair<const_char_*,_unsigned_int> *)&p_local,(char **)&byte_1,&byte);
      goto LAB_00834650;
    }
  }
  local_3c = 5;
  do {
    if (9 < local_3c) {
      local_50 = (void *)0x0;
      local_54 = 0;
      std::pair<const_char_*,_unsigned_int>::pair<std::nullptr_t,_int,_true>
                ((pair<const_char_*,_unsigned_int> *)&p_local,&local_50,&local_54);
LAB_00834650:
      pVar1._12_4_ = 0;
      pVar1.first = p_local;
      pVar1.second = local_10;
      return pVar1;
    }
    local_40 = (uint)(byte)p[local_3c];
    if (local_40 < 0x80) {
      local_48 = p + (ulong)local_3c + 1;
      std::pair<const_char_*,_unsigned_int>::pair<const_char_*,_unsigned_int_&,_true>
                ((pair<const_char_*,_unsigned_int> *)&p_local,&local_48,&byte);
      goto LAB_00834650;
    }
    local_3c = local_3c + 1;
  } while( true );
}

Assistant:

std::pair<const char*, uint32_t> VarintParseSlow32(const char* p,
                                                   uint32_t res) {
  for (std::uint32_t i = 1; i < 5; i++) {
    uint32_t byte = static_cast<uint8_t>(p[i]);
    res += (byte - 1) << (7 * i);
    if (ABSL_PREDICT_TRUE(byte < 128)) {
      return {p + i + 1, res};
    }
  }
  // Accept >5 bytes
  for (std::uint32_t i = 5; i < 10; i++) {
    uint32_t byte = static_cast<uint8_t>(p[i]);
    if (ABSL_PREDICT_TRUE(byte < 128)) {
      return {p + i + 1, res};
    }
  }
  return {nullptr, 0};
}